

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_fast_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int originalSize)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  byte bVar3;
  BYTE BVar4;
  ushort uVar5;
  undefined8 uVar6;
  ushort uVar7;
  U32 length;
  int iVar8;
  uint uVar9;
  ushort *puVar10;
  ushort *puVar11;
  BYTE *pBVar12;
  uint8_t *puVar13;
  uint uVar14;
  BYTE *pBVar15;
  ulong uVar16;
  BYTE *d_2;
  BYTE *pBVar17;
  BYTE *pBVar18;
  BYTE *__src;
  BYTE *s;
  BYTE *d;
  BYTE *pBVar19;
  BYTE *pBVar20;
  ulong uVar21;
  ulong uVar22;
  int local_50;
  BYTE *local_38;
  
  uVar21 = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (uVar21 == 0) {
    iVar8 = LZ4_decompress_fast(source,dest,originalSize);
  }
  else {
    if ((LZ4_streamDecode->internal_donotuse).prefixEnd == (uint8_t *)dest) {
      if ((uVar21 < 0xffff) && (LZ4_streamDecode->table[1] != 0)) {
        if (source == (char *)0x0) {
          source = (char *)0xffffffff;
        }
        else {
          puVar13 = (LZ4_streamDecode->internal_donotuse).externalDict + LZ4_streamDecode->table[1];
          if ((LZ4_streamDecode->internal_donotuse).externalDict == (uint8_t *)0x0) {
            puVar13 = (uint8_t *)0x0;
          }
          if (originalSize == 0) {
            source = (char *)(ulong)(-(uint)(*source != '\0') | 1);
          }
          else {
            __src = (BYTE *)(dest + -uVar21);
            pBVar1 = (BYTE *)(dest + originalSize);
            local_50 = (int)source;
            pBVar20 = (BYTE *)dest;
            if (originalSize < 0x40) {
LAB_0011813a:
              do {
                bVar3 = (byte)*(ushort *)source;
                source = (char *)((long)source + 1);
                while( true ) {
                  uVar14 = (uint)bVar3;
                  uVar21 = (ulong)(bVar3 >> 4);
                  if ((0x8f < uVar14) || (dest + (long)originalSize + -0x1a < pBVar20)) break;
                  *(undefined8 *)pBVar20 = *(undefined8 *)source;
                  pBVar19 = pBVar20 + uVar21;
                  uVar16 = (ulong)(uVar14 & 0xf);
                  puVar11 = (ushort *)((long)source + uVar21);
                  uVar5 = *puVar11;
                  pBVar17 = pBVar19 + -(ulong)uVar5;
                  if ((((uVar14 & 0xf) == 0xf) || (uVar5 < 8)) || (pBVar17 < __src))
                  goto LAB_00118022;
                  *(undefined8 *)pBVar19 = *(undefined8 *)pBVar17;
                  *(undefined8 *)(pBVar19 + 8) = *(undefined8 *)(pBVar17 + 8);
                  *(undefined2 *)(pBVar19 + 0x10) = *(undefined2 *)(pBVar17 + 0x10);
                  pBVar20 = pBVar19 + uVar16 + 4;
                  bVar3 = *(byte *)((long)source + uVar21 + 2);
                  source = (char *)((long)source + uVar21 + 3);
                }
                if (bVar3 >> 4 == 0xf) {
                  uVar9 = 0;
                  do {
                    uVar5 = *(ushort *)source;
                    source = (char *)((long)source + 1);
                    uVar9 = uVar9 + (byte)uVar5;
                  } while ((byte)uVar5 == 0xff);
                  uVar21 = (ulong)uVar9 + 0xf;
                }
                pBVar19 = pBVar20 + uVar21;
LAB_00117feb:
                puVar11 = (ushort *)source;
                if (dest + (long)originalSize + -8 < pBVar19) {
                  if (pBVar19 != pBVar1) goto LAB_00117f3a;
                  memmove(pBVar20,source,uVar21);
                  source = (char *)(ulong)(uint)(((int)source + (int)uVar21) - local_50);
                  goto LAB_00117c8e;
                }
                do {
                  *(undefined8 *)pBVar20 = *(undefined8 *)puVar11;
                  pBVar20 = pBVar20 + 8;
                  puVar11 = puVar11 + 4;
                } while (pBVar20 < pBVar19);
                puVar11 = (ushort *)((long)source + uVar21);
                uVar5 = *puVar11;
                pBVar17 = pBVar19 + -(ulong)uVar5;
                uVar16 = (ulong)(uVar14 & 0xf);
LAB_00118022:
                source = (char *)(puVar11 + 1);
                if ((int)uVar16 == 0xf) {
                  uVar14 = 0;
                  do {
                    uVar7 = *(ushort *)source;
                    source = (char *)((long)source + 1);
                    uVar14 = uVar14 + (byte)uVar7;
                  } while ((byte)uVar7 == 0xff);
                  uVar16 = (ulong)uVar14 + 0xf;
                }
                uVar16 = uVar16 + 4;
LAB_00118046:
                pBVar2 = pBVar19 + uVar16;
                pBVar20 = pBVar2;
                if (pBVar17 < __src) {
                  if (pBVar1 + -5 < pBVar2) goto LAB_00117f3a;
                  uVar21 = (long)__src - (long)pBVar17;
                  uVar22 = uVar16 - uVar21;
                  if (uVar16 < uVar21 || uVar22 == 0) {
                    memmove(pBVar19,puVar13 + -uVar21,uVar16);
                  }
                  else {
                    memcpy(pBVar19,puVar13 + -uVar21,uVar21);
                    pBVar20 = pBVar19 + uVar21;
                    if ((ulong)((long)pBVar20 - (long)__src) < uVar22) {
                      pBVar19 = __src;
                      if ((long)uVar21 < (long)uVar16) {
                        do {
                          *pBVar20 = *pBVar19;
                          pBVar20 = pBVar20 + 1;
                          pBVar19 = pBVar19 + 1;
                        } while (pBVar20 < pBVar2);
                      }
                    }
                    else {
                      memcpy(pBVar20,__src,uVar22);
                      pBVar20 = pBVar2;
                    }
                  }
                  goto LAB_0011813a;
                }
                if (uVar5 < 8) {
                  LZ4_decompress_fast_continue_cold_1();
                  pBVar17 = local_38;
                }
                else {
                  *(undefined8 *)pBVar19 = *(undefined8 *)pBVar17;
                  pBVar17 = pBVar17 + 8;
                }
                pBVar12 = pBVar19 + 8;
                if (pBVar2 <= pBVar1 + -0xc) {
                  *(undefined8 *)pBVar12 = *(undefined8 *)pBVar17;
                  if (0x10 < uVar16) {
                    pBVar19 = pBVar19 + 0x10;
                    do {
                      pBVar17 = pBVar17 + 8;
                      *(undefined8 *)pBVar19 = *(undefined8 *)pBVar17;
                      pBVar19 = pBVar19 + 8;
                    } while (pBVar19 < pBVar2);
                  }
                  goto LAB_0011813a;
                }
                iVar8 = 5;
                if (pBVar2 <= pBVar1 + -5) {
                  pBVar19 = pBVar1 + -7;
                  pBVar15 = pBVar17;
                  pBVar18 = pBVar12;
                  if (pBVar12 < pBVar19) {
                    do {
                      *(undefined8 *)pBVar18 = *(undefined8 *)pBVar15;
                      pBVar18 = pBVar18 + 8;
                      pBVar15 = pBVar15 + 8;
                    } while (pBVar18 < pBVar19);
                    pBVar17 = pBVar17 + ((long)pBVar19 - (long)pBVar12);
                    pBVar12 = pBVar19;
                  }
                  iVar8 = 0;
                  for (; pBVar12 < pBVar2; pBVar12 = pBVar12 + 1) {
                    BVar4 = *pBVar17;
                    pBVar17 = pBVar17 + 1;
                    *pBVar12 = BVar4;
                  }
                }
              } while (iVar8 == 0);
              if (iVar8 != 5) goto LAB_00117c8e;
            }
            else {
LAB_00117ccf:
              bVar3 = (byte)*(ushort *)source;
              uVar14 = (uint)bVar3;
              uVar9 = (uint)(bVar3 >> 4);
              if (uVar9 == 0xf) {
                uVar9 = 0;
                puVar11 = (ushort *)((long)source + 0x10);
                do {
                  puVar10 = puVar11;
                  uVar9 = uVar9 + *(byte *)((long)puVar10 + -0xf);
                  puVar11 = (ushort *)((long)puVar10 + 1);
                } while (*(byte *)((long)puVar10 + -0xf) == 0xff);
                uVar21 = (ulong)uVar9;
                pBVar19 = pBVar20 + uVar21 + 0xf;
                source = (char *)(puVar10 + -7);
                iVar8 = 6;
                if (pBVar19 <= dest + (long)originalSize + -8) {
                  do {
                    *(undefined8 *)pBVar20 = *(undefined8 *)source;
                    pBVar20 = pBVar20 + 8;
                    source = (char *)((long)source + 8);
                  } while (pBVar20 < pBVar19);
                  source = (char *)((long)puVar10 + 1 + uVar21);
                  iVar8 = 0;
                  pBVar20 = pBVar19;
                }
                if (iVar8 != 0) {
                  if (iVar8 == 6) {
                    uVar21 = uVar21 + 0xf;
                    goto LAB_00117feb;
                  }
                  goto LAB_00117c8e;
                }
              }
              else {
                *(undefined8 *)pBVar20 = *(undefined8 *)((long)source + 1);
                if (0x8f < bVar3) {
                  *(undefined8 *)(pBVar20 + 8) = *(undefined8 *)((long)source + 9);
                }
                source = (char *)((byte *)((long)source + 1) + uVar9);
                pBVar20 = pBVar20 + uVar9;
              }
              pBVar19 = pBVar20;
              uVar5 = *(ushort *)source;
              uVar21 = (ulong)uVar5;
              source = (char *)((long)source + 2);
              pBVar17 = pBVar19 + -uVar21;
              uVar22 = (ulong)(bVar3 & 0xf);
              if (uVar22 == 0xf) {
                uVar14 = 0;
                do {
                  uVar7 = *(ushort *)source;
                  source = (char *)((long)source + 1);
                  uVar14 = uVar14 + (byte)uVar7;
                } while ((byte)uVar7 == 0xff);
                uVar16 = (ulong)uVar14 + 0x13;
                if (pBVar1 + -0x40 <= pBVar19 + (ulong)uVar14 + 0x13) goto LAB_00118046;
              }
              else {
                uVar16 = uVar22 + 4;
                if (pBVar1 + -0x40 <= pBVar19 + uVar22 + 4) goto LAB_00118046;
                if ((__src <= pBVar17) && (7 < uVar5)) {
                  *(undefined8 *)pBVar19 = *(undefined8 *)pBVar17;
                  *(undefined8 *)(pBVar19 + 8) = *(undefined8 *)(pBVar17 + 8);
                  *(undefined2 *)(pBVar19 + 0x10) = *(undefined2 *)(pBVar17 + 0x10);
                  pBVar20 = pBVar19 + uVar22 + 4;
                  goto LAB_00117ccf;
                }
              }
              pBVar2 = pBVar19 + uVar16;
              pBVar20 = pBVar2;
              if (__src <= pBVar17) {
                if (uVar5 < 0x10) {
                  LZ4_memcpy_using_offset(pBVar19,pBVar17,pBVar2,uVar21);
                }
                else {
                  do {
                    uVar6 = *(undefined8 *)(pBVar19 + -uVar21 + 8);
                    *(undefined8 *)pBVar19 = *(undefined8 *)(pBVar19 + -uVar21);
                    *(undefined8 *)(pBVar19 + 8) = uVar6;
                    uVar6 = *(undefined8 *)(pBVar19 + -uVar21 + 0x10 + 8);
                    *(undefined8 *)(pBVar19 + 0x10) = *(undefined8 *)(pBVar19 + -uVar21 + 0x10);
                    *(undefined8 *)(pBVar19 + 0x18) = uVar6;
                    pBVar19 = pBVar19 + 0x20;
                  } while (pBVar19 < pBVar2);
                }
                goto LAB_00117ccf;
              }
              if (pBVar2 <= pBVar1 + -5) {
                uVar21 = (long)__src - (long)pBVar17;
                uVar22 = uVar16 - uVar21;
                if (uVar16 < uVar21 || uVar22 == 0) {
                  memmove(pBVar19,puVar13 + -uVar21,uVar16);
                }
                else {
                  memcpy(pBVar19,puVar13 + -uVar21,uVar21);
                  pBVar20 = pBVar19 + uVar21;
                  if ((ulong)((long)pBVar20 - (long)__src) < uVar22) {
                    pBVar19 = __src;
                    if ((long)uVar21 < (long)uVar16) {
                      do {
                        *pBVar20 = *pBVar19;
                        pBVar20 = pBVar20 + 1;
                        pBVar19 = pBVar19 + 1;
                      } while (pBVar20 < pBVar2);
                    }
                  }
                  else {
                    memcpy(pBVar20,__src,uVar22);
                    pBVar20 = pBVar2;
                  }
                }
                goto LAB_00117ccf;
              }
            }
LAB_00117f3a:
            source = (char *)(ulong)(~(uint)source + local_50);
          }
        }
      }
      else {
        uVar14 = LZ4_decompress_fast(source,dest,originalSize);
        source = (char *)(ulong)uVar14;
      }
LAB_00117c8e:
      iVar8 = (int)source;
      if (iVar8 < 1) {
        return iVar8;
      }
      LZ4_streamDecode->table[3] = LZ4_streamDecode->table[3] + (long)originalSize;
      (LZ4_streamDecode->internal_donotuse).prefixEnd =
           (LZ4_streamDecode->internal_donotuse).prefixEnd + originalSize;
      return iVar8;
    }
    (LZ4_streamDecode->internal_donotuse).extDictSize = uVar21;
    puVar13 = (LZ4_streamDecode->internal_donotuse).prefixEnd + -uVar21;
    (LZ4_streamDecode->internal_donotuse).externalDict = puVar13;
    iVar8 = LZ4_decompress_fast_extDict(source,dest,originalSize,puVar13,uVar21);
  }
  if (0 < iVar8) {
    LZ4_streamDecode->table[3] = (long)originalSize;
    (LZ4_streamDecode->internal_donotuse).prefixEnd = (uint8_t *)(dest + originalSize);
  }
  return iVar8;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
int LZ4_decompress_fast_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int originalSize)
{
    LZ4_streamDecode_t_internal* lz4sd = &LZ4_streamDecode->internal_donotuse;
    int result;
    assert(originalSize >= 0);

    if (lz4sd->prefixSize == 0) {
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_fast(source, dest, originalSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd = (BYTE*)dest + originalSize;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        if (lz4sd->prefixSize >= 64 KB - 1 || lz4sd->extDictSize == 0)
            result = LZ4_decompress_fast(source, dest, originalSize);
        else
            result = LZ4_decompress_fast_doubleDict(source, dest, originalSize,
                                                    lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)originalSize;
        lz4sd->prefixEnd  += originalSize;
    } else {
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_fast_extDict(source, dest, originalSize,
                                             lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd  = (BYTE*)dest + originalSize;
    }

    return result;
}